

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::StringMaker<std::chrono::duration<long,std::ratio<1l,1l>>,void>::convert_abi_cxx11_
          (string *__return_storage_ptr__,
          StringMaker<std::chrono::duration<long,std::ratio<1l,1l>>,void> *this,
          duration<long,_std::ratio<1L,_1L>_> *duration)

{
  ReusableStringStream rss;
  ReusableStringStream local_30;
  
  ReusableStringStream::ReusableStringStream(&local_30);
  std::ostream::_M_insert<long>((long)local_30.m_oss);
  std::operator<<((ostream *)local_30.m_oss," s");
  std::__cxx11::stringbuf::str();
  ReusableStringStream::~ReusableStringStream(&local_30);
  return __return_storage_ptr__;
}

Assistant:

static std::string convert(std::chrono::duration<Value, std::ratio<1>> const& duration) {
            ReusableStringStream rss;
            rss << duration.count() << " s";
            return rss.str();
        }